

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_QButtonGroupBox.cpp
# Opt level: O0

int __thiscall QButtonGroupBox::qt_metacall(QButtonGroupBox *this,Call _c,int _id,void **_a)

{
  undefined8 *in_RCX;
  uint in_EDX;
  int in_ESI;
  Call in_EDI;
  void **in_stack_00000030;
  int in_stack_00000038;
  Call in_stack_0000003c;
  QObject *in_stack_00000040;
  QMetaType local_28;
  undefined8 *local_20;
  int local_18;
  int local_14;
  int local_4;
  
  local_20 = in_RCX;
  local_14 = in_ESI;
  local_18 = QGroupBox::qt_metacall(in_EDI,in_ESI,(void **)(ulong)in_EDX);
  local_4 = local_18;
  if (-1 < local_18) {
    if (local_14 == 0) {
      if (local_18 < 4) {
        qt_static_metacall(in_stack_00000040,in_stack_0000003c,in_stack_00000038,in_stack_00000030);
      }
      local_18 = local_18 + -4;
    }
    else if (local_14 == 7) {
      if (local_18 < 4) {
        memset(&local_28,0,8);
        QMetaType::QMetaType(&local_28);
        *(QMetaTypeInterface **)*local_20 = local_28.d_ptr;
      }
      local_18 = local_18 + -4;
    }
    else if ((((local_14 == 1) || (local_14 == 2)) || (local_14 == 3)) ||
            ((local_14 == 8 || (local_14 == 6)))) {
      qt_static_metacall(in_stack_00000040,in_stack_0000003c,in_stack_00000038,in_stack_00000030);
      local_18 = local_18 + -9;
    }
    local_4 = local_18;
  }
  return local_4;
}

Assistant:

int QButtonGroupBox::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QGroupBox::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 4)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 4;
    } else if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 4)
            *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType();
        _id -= 4;
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty
            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty
            || _c == QMetaObject::RegisterPropertyMetaType) {
        qt_static_metacall(this, _c, _id, _a);
        _id -= 9;
    }
#endif // QT_NO_PROPERTIES
    return _id;
}